

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  float *pfVar1;
  float *pfVar2;
  ImDrawList *pIVar3;
  ImDrawCmd *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  
  iVar9 = this->CmdListsCount;
  if (0 < iVar9) {
    lVar8 = 0;
    do {
      pIVar3 = this->CmdLists[lVar8];
      if (0 < (pIVar3->CmdBuffer).Size) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          pIVar4 = (pIVar3->CmdBuffer).Data;
          pfVar1 = (float *)((long)&(pIVar4->ClipRect).x + lVar10);
          fVar5 = pfVar1[1];
          fVar6 = pfVar1[2];
          fVar7 = pfVar1[3];
          fVar12 = (*fb_scale).x;
          fVar13 = (*fb_scale).y;
          pfVar2 = (float *)((long)&(pIVar4->ClipRect).x + lVar10);
          *pfVar2 = *pfVar1 * fVar12;
          pfVar2[1] = fVar5 * fVar13;
          pfVar2[2] = fVar6 * fVar12;
          pfVar2[3] = fVar7 * fVar13;
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0x38;
        } while (lVar11 < (pIVar3->CmdBuffer).Size);
        iVar9 = this->CmdListsCount;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar9);
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}